

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O0

void __thiscall
mxx::custom_op<int>::custom_op<MxxReduce_ReduceOne_Test::TestBody()::__0>
          (custom_op<int> *this,byte param_2)

{
  MPI_Op poVar1;
  MPI_Datatype poVar2;
  int local_84;
  undefined1 local_80 [8];
  datatype dt_1;
  undefined1 local_58 [8];
  datatype dt;
  MPI_Op op;
  bool commutative_local;
  custom_op<int> *this_local;
  
  this->_vptr_custom_op = (_func_int **)&PTR__custom_op_00203290;
  std::function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)>::function(&this->m_user_func);
  this->m_builtin = false;
  poVar1 = get_builtin_op<int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp:138:40)>
           ::op();
  if (poVar1 != (MPI_Op)&ompi_mpi_op_null) {
    this->m_builtin = true;
    this->m_op = poVar1;
    get_datatype<int>();
    poVar2 = mxx::datatype::type((datatype *)local_58);
    this->m_type_copy = poVar2;
    mxx::datatype::~datatype((datatype *)local_58);
  }
  if ((this->m_builtin & 1U) == 0) {
    std::
    bind<void(&)(MxxReduce_ReduceOne_Test::TestBody()::__0,void*,void*,int*,ompi_datatype_t**),MxxReduce_ReduceOne_Test::TestBody()::__0,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&,std::_Placeholder<4>const&>
              ((type *)&dt_1.builtin,custom_function<MxxReduce_ReduceOne_Test::TestBody()::__0>,
               (type *)((long)&this_local + 7),(_Placeholder<1> *)&std::placeholders::_1,
               (_Placeholder<2> *)&std::placeholders::_2,(_Placeholder<3> *)&std::placeholders::_3,
               (_Placeholder<4> *)&std::placeholders::_4);
    std::function<void(void*,void*,int*,ompi_datatype_t**)>::operator=
              ((function<void(void*,void*,int*,ompi_datatype_t**)> *)&this->m_user_func,
               (_Bind<void_(*((lambda_at__workspace_llm4binary_github_license_c_cmakelists_patflick[P]mxx_test_test_reductions_cpp:138:40),_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>))((lambda_at__workspace_llm4binary_github_license_c_cmakelists_patflick[P]mxx_test_test_reductions_cpp:138:40),_void_*,_void_*,_int_*,_ompi_datatype_t_**)>
                *)&dt_1.builtin);
    get_datatype<int>();
    poVar2 = mxx::datatype::type((datatype *)local_80);
    MPI_Type_dup(poVar2,&this->m_type_copy);
    local_84 = 0x543;
    attr_map<int,_std::function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)>_>::set
              (&this->m_type_copy,&local_84,&this->m_user_func);
    MPI_Op_create(mpi_user_function,param_2 & 1,&this->m_op);
    mxx::datatype::~datatype((datatype *)local_80);
  }
  return;
}

Assistant:

custom_op(Func func, const bool commutative = true) : m_builtin(false) {
        if (mxx::is_builtin_type<T>::value) {
            // check if the operator is MPI built-in (in case the type
            // is also a MPI built-in type)
            MPI_Op op = get_builtin_op<T, Func>::op(std::forward<Func>(func));
            if (op != MPI_OP_NULL) {
                // this op is builtin, save it as such and don't copy built-in type
                m_builtin = true;
                m_op = op;
                mxx::datatype dt = mxx::get_datatype<T>();
                m_type_copy = dt.type();
            }
        }
        if (!m_builtin) {
            // create user function
            namespace ph = std::placeholders;
            m_user_func = std::bind(custom_op::custom_function<Func>,
                                   std::forward<Func>(func),
                                   ph::_1, ph::_2, ph::_3, ph::_4);
            // get datatype associated with the type `T`
            mxx::datatype dt = mxx::get_datatype<T>();
            // attach function to a copy of the datatype
            MPI_Type_dup(dt.type(), &m_type_copy);
            attr_map<int, func_t>::set(m_type_copy, 1347, m_user_func);
            // create op
            MPI_Op_create(&custom_op::mpi_user_function, commutative, &m_op);
        }
    }